

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall
Hospital::Existence_Of_User_Name
          (Hospital *this,string *User_Name,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  pointer pNVar1;
  pointer pDVar2;
  pointer pPVar3;
  __type _Var4;
  ulong uVar5;
  ulong uVar6;
  Human *pHVar7;
  long lVar8;
  string local_50;
  
  uVar6 = 0xffffffffffffffff;
  lVar8 = 0;
  do {
    pNVar1 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = uVar6 + 1;
    if ((ulong)(((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pNVar1) / 0x158) <= uVar6) {
      uVar6 = 0xffffffffffffffff;
      lVar8 = 0;
      do {
        pDVar2 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
        if ((ulong)(((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x178) <=
            uVar6) {
          uVar6 = 0xffffffffffffffff;
          lVar8 = 0;
          do {
            pPVar3 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x150;
            uVar6 = uVar6 + 1;
            if (uVar5 <= uVar6) {
              return uVar6 < uVar5;
            }
            pHVar7 = (Human *)((long)&(pPVar3->super_Human).Id._M_dataplus + lVar8);
            lVar8 = lVar8 + 0x150;
            Human::User_name_Getter_abi_cxx11_(&local_50,pHVar7);
            _Var4 = std::operator==(&local_50,User_Name);
            std::__cxx11::string::~string((string *)&local_50);
          } while (!_Var4);
          return uVar6 < uVar5;
        }
        pHVar7 = (Human *)((long)&(pDVar2->super_Human).Id._M_dataplus + lVar8);
        lVar8 = lVar8 + 0x178;
        Human::User_name_Getter_abi_cxx11_(&local_50,pHVar7);
        _Var4 = std::operator==(&local_50,User_Name);
        std::__cxx11::string::~string((string *)&local_50);
      } while (!_Var4);
      return true;
    }
    pHVar7 = (Human *)((long)&(pNVar1->super_Human).Id._M_dataplus + lVar8);
    lVar8 = lVar8 + 0x158;
    Human::User_name_Getter_abi_cxx11_(&local_50,pHVar7);
    _Var4 = std::operator==(&local_50,User_Name);
    std::__cxx11::string::~string((string *)&local_50);
  } while (!_Var4);
  return true;
}

Assistant:

bool Hospital:: Existence_Of_User_Name (string User_Name , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients ){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == User_Name) return true;
    }
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].User_name_Getter() == User_Name) return true;
    }
    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if (All_Of_Patients[i].User_name_Getter() == User_Name) return true;
    }
    return false;
}